

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_request_state(connectdata *conn,_Bool *done)

{
  curl_off_t *pcVar1;
  _Bool _Var2;
  undefined2 uVar3;
  int *piVar4;
  char *pcVar5;
  char *__s;
  curl_off_t cVar6;
  void *pvVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  undefined4 uVar12;
  __pid_t _Var13;
  smb_request *req;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  smb_request *req_1;
  long lVar17;
  ulong len;
  short sVar18;
  size_t upload_size;
  Curl_easy *pCVar19;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_470;
  undefined1 local_464;
  undefined1 uStack_463;
  undefined1 local_462;
  undefined2 uStack_461;
  undefined1 uStack_45f;
  undefined1 uStack_45e;
  undefined1 uStack_45d;
  undefined1 uStack_45c;
  undefined2 uStack_45b;
  undefined2 uStack_459;
  char acStack_457 [3];
  undefined2 uStack_454;
  undefined1 uStack_452;
  char acStack_451 [2];
  undefined4 uStack_44f;
  undefined2 uStack_44b;
  char local_444 [4];
  int local_440;
  short local_433;
  char local_431 [1025];
  
  piVar4 = (int *)(conn->data->req).protop;
  local_470 = (void *)0x0;
  if (*piVar4 == 0) {
    pcVar5 = (conn->host).name;
    sVar14 = strlen(pcVar5);
    __s = *(char **)(piVar4 + 2);
    sVar15 = strlen(__s);
    if ((sVar15 + sVar14) - 0x3f7 < 0xfffffffffffffbff) {
      CVar10 = CURLE_FILESIZE_EXCEEDED;
      goto LAB_00574c33;
    }
    memset(&local_462,0,0x409);
    local_464 = 4;
    uStack_463 = 0xff;
    uStack_459 = 0x5c5c;
    acStack_457[0] = '\0';
    strcpy(acStack_457,pcVar5);
    sVar14 = strlen(pcVar5);
    (acStack_457 + sVar14)[0] = '\\';
    (acStack_457 + sVar14)[1] = '\0';
    strcpy(acStack_457 + sVar14 + 1,__s);
    sVar15 = strlen(__s);
    builtin_strncpy(acStack_457 + sVar15 + sVar14 + 2,"????",4);
    (acStack_451 + sVar15 + sVar14)[0] = '?';
    (acStack_451 + sVar15 + sVar14)[1] = '\0';
    uStack_45b = (short)(acStack_457 + ((sVar15 + sVar14) - (long)&uStack_459) + 1) + 7;
    CVar10 = smb_send_message(conn,'u',&local_464,
                              (size_t)(acStack_457 + ((sVar15 + sVar14) - (long)&uStack_459) + 1 +
                                      0x12));
    if (CVar10 != CURLE_OK) goto LAB_00574c33;
    *(undefined4 *)(conn->data->req).protop = 1;
  }
  CVar10 = smb_send_and_recv(conn,&local_470);
  pvVar7 = local_470;
  if ((CVar10 != CURLE_OK) && (CVar10 != CURLE_AGAIN)) {
LAB_00574c33:
    Curl_conncontrol(conn,1);
    return CVar10;
  }
  CVar10 = CURLE_OK;
  if (local_470 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(*piVar4) {
  case 1:
    if (*(int *)((long)local_470 + 9) == 0) {
      *(undefined2 *)(piVar4 + 6) = *(undefined2 *)((long)local_470 + 0x1c);
      (conn->proto).ftpc.pp.response.tv_usec = 0;
      pCVar19 = conn->data;
      pcVar5 = *(char **)((long)(pCVar19->req).protop + 0x10);
      sVar14 = strlen(pcVar5);
      CVar11 = CURLE_FILESIZE_EXCEEDED;
      if (0xfffffffffffffbfe < sVar14 - 0x400) {
        memset(&local_462,0,0x431);
        local_464 = 0x18;
        uStack_463 = 0xff;
        uStack_45e = (undefined1)sVar14;
        uStack_45d = (undefined1)(sVar14 >> 8);
        local_444[0] = '\a';
        local_444[1] = '\0';
        local_444[2] = '\0';
        local_444[3] = '\0';
        _Var2 = (pCVar19->set).upload;
        acStack_451[0] = (_Var2 - 2U) * '@';
        local_440 = (uint)_Var2 * 4 + 1;
        uStack_454 = 0;
        uStack_452 = 0;
        local_433 = (short)sVar14 + 1;
        strcpy(local_431,pcVar5);
        CVar11 = smb_send_message(conn,0xa2,&local_464,sVar14 + 0x34);
      }
      uVar12 = 2;
      goto LAB_005750a1;
    }
    CVar11 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)local_470 + 9) == 0x50001) {
      CVar11 = CURLE_REMOTE_ACCESS_DENIED;
    }
    piVar4[7] = CVar11;
    break;
  case 2:
    if ((*(int *)((long)local_470 + 9) == 0) && (99 < (ulong)(conn->proto).ftpc.pp.response.tv_usec)
       ) {
      *(undefined2 *)((long)piVar4 + 0x1a) = *(undefined2 *)((long)local_470 + 0x2a);
      pCVar19 = conn->data;
      (pCVar19->req).offset = 0;
      if ((pCVar19->set).upload == true) {
        cVar6 = (pCVar19->state).infilesize;
        (pCVar19->req).size = cVar6;
        Curl_pgrsSetUploadSize(pCVar19,cVar6);
        pCVar19 = conn->data;
        lVar17 = (pCVar19->req).size;
        lVar16 = (pCVar19->req).bytecount;
LAB_00574ecf:
        upload_size = lVar17 - lVar16;
        (conn->proto).ftpc.pp.response.tv_usec = 0;
        cVar6 = (pCVar19->req).offset;
        pvVar7 = (pCVar19->req).protop;
        if (0x7ffe < (long)upload_size) {
          upload_size = 0x7fff;
        }
        (pCVar19->state).uploadbuffer[0x20] = '\0';
        (pCVar19->state).uploadbuffer[0x21] = '\0';
        (pCVar19->state).uploadbuffer[0x22] = '\0';
        (pCVar19->state).uploadbuffer[0x23] = '\0';
        (pCVar19->state).uploadbuffer[0x24] = '\0';
        (pCVar19->state).uploadbuffer[0x25] = '\0';
        (pCVar19->state).uploadbuffer[0x26] = '\0';
        (pCVar19->state).uploadbuffer[0x27] = '\0';
        (pCVar19->state).uploadbuffer[0x28] = '\0';
        (pCVar19->state).uploadbuffer[0x29] = '\0';
        (pCVar19->state).uploadbuffer[0x2a] = '\0';
        (pCVar19->state).uploadbuffer[0x2b] = '\0';
        (pCVar19->state).uploadbuffer[0x2c] = '\0';
        (pCVar19->state).uploadbuffer[0x2d] = '\0';
        (pCVar19->state).uploadbuffer[0x2e] = '\0';
        (pCVar19->state).uploadbuffer[0x2f] = '\0';
        (pCVar19->state).uploadbuffer[0] = '\0';
        (pCVar19->state).uploadbuffer[1] = '\0';
        (pCVar19->state).uploadbuffer[2] = '\0';
        (pCVar19->state).uploadbuffer[3] = '\0';
        (pCVar19->state).uploadbuffer[4] = '\0';
        (pCVar19->state).uploadbuffer[5] = '\0';
        (pCVar19->state).uploadbuffer[6] = '\0';
        (pCVar19->state).uploadbuffer[7] = '\0';
        (pCVar19->state).uploadbuffer[8] = '\0';
        (pCVar19->state).uploadbuffer[9] = '\0';
        (pCVar19->state).uploadbuffer[10] = '\0';
        (pCVar19->state).uploadbuffer[0xb] = '\0';
        (pCVar19->state).uploadbuffer[0xc] = '\0';
        (pCVar19->state).uploadbuffer[0xd] = '\0';
        (pCVar19->state).uploadbuffer[0xe] = '\0';
        (pCVar19->state).uploadbuffer[0xf] = '\0';
        (pCVar19->state).uploadbuffer[0x10] = '\0';
        (pCVar19->state).uploadbuffer[0x11] = '\0';
        (pCVar19->state).uploadbuffer[0x12] = '\0';
        (pCVar19->state).uploadbuffer[0x13] = '\0';
        (pCVar19->state).uploadbuffer[0x14] = '\0';
        (pCVar19->state).uploadbuffer[0x15] = '\0';
        (pCVar19->state).uploadbuffer[0x16] = '\0';
        (pCVar19->state).uploadbuffer[0x17] = '\0';
        (pCVar19->state).uploadbuffer[0x18] = '\0';
        (pCVar19->state).uploadbuffer[0x19] = '\0';
        (pCVar19->state).uploadbuffer[0x1a] = '\0';
        (pCVar19->state).uploadbuffer[0x1b] = '\0';
        (pCVar19->state).uploadbuffer[0x1c] = '\0';
        (pCVar19->state).uploadbuffer[0x1d] = '\0';
        (pCVar19->state).uploadbuffer[0x1e] = '\0';
        (pCVar19->state).uploadbuffer[0x1f] = '\0';
        (pCVar19->state).uploadbuffer[0x30] = '\0';
        (pCVar19->state).uploadbuffer[0x31] = '\0';
        (pCVar19->state).uploadbuffer[0x32] = '\0';
        (pCVar19->state).uploadbuffer[0x33] = '\0';
        (pCVar19->state).uploadbuffer[0x34] = '\0';
        (pCVar19->state).uploadbuffer[0x35] = '\0';
        (pCVar19->state).uploadbuffer[0x36] = '\0';
        (pCVar19->state).uploadbuffer[0x37] = '\0';
        (pCVar19->state).uploadbuffer[0x38] = '\0';
        (pCVar19->state).uploadbuffer[0x39] = '\0';
        (pCVar19->state).uploadbuffer[0x3a] = '\0';
        (pCVar19->state).uploadbuffer[0x3b] = '\0';
        (pCVar19->state).uploadbuffer[0x3c] = '\0';
        (pCVar19->state).uploadbuffer[0x3d] = '\0';
        (pCVar19->state).uploadbuffer[0x3e] = '\0';
        (pCVar19->state).uploadbuffer[0x3f] = '\0';
        (pCVar19->state).uploadbuffer[0x40] = '\0';
        (pCVar19->state).uploadbuffer[0x41] = '\0';
        (pCVar19->state).uploadbuffer[0x42] = '\0';
        (pCVar19->state).uploadbuffer[0x43] = '\0';
        (pCVar19->state).uploadbuffer[0x24] = '\x0e';
        (pCVar19->state).uploadbuffer[0x25] = -1;
        *(undefined2 *)((pCVar19->state).uploadbuffer + 0x29) = *(undefined2 *)((long)pvVar7 + 0x1a)
        ;
        *(int *)((pCVar19->state).uploadbuffer + 0x2b) = (int)cVar6;
        *(int *)((pCVar19->state).uploadbuffer + 0x3d) = (int)((ulong)cVar6 >> 0x20);
        sVar18 = (short)upload_size;
        *(short *)((pCVar19->state).uploadbuffer + 0x39) = sVar18;
        (pCVar19->state).uploadbuffer[0x3b] = '@';
        (pCVar19->state).uploadbuffer[0x3c] = '\0';
        *(short *)((pCVar19->state).uploadbuffer + 0x41) = sVar18 + 1;
        pvVar7 = (conn->data->req).protop;
        (pCVar19->state).uploadbuffer[0] = '\0';
        (pCVar19->state).uploadbuffer[1] = '\0';
        (pCVar19->state).uploadbuffer[2] = '\0';
        (pCVar19->state).uploadbuffer[3] = '\0';
        (pCVar19->state).uploadbuffer[4] = '\0';
        (pCVar19->state).uploadbuffer[5] = '\0';
        (pCVar19->state).uploadbuffer[6] = '\0';
        (pCVar19->state).uploadbuffer[7] = '\0';
        (pCVar19->state).uploadbuffer[8] = '\0';
        (pCVar19->state).uploadbuffer[9] = '\0';
        (pCVar19->state).uploadbuffer[10] = '\0';
        (pCVar19->state).uploadbuffer[0xb] = '\0';
        (pCVar19->state).uploadbuffer[0xc] = '\0';
        (pCVar19->state).uploadbuffer[0xd] = '\0';
        (pCVar19->state).uploadbuffer[0xe] = '\0';
        (pCVar19->state).uploadbuffer[0xf] = '\0';
        (pCVar19->state).uploadbuffer[0x20] = '\0';
        (pCVar19->state).uploadbuffer[0x21] = '\0';
        (pCVar19->state).uploadbuffer[0x22] = '\0';
        (pCVar19->state).uploadbuffer[0x23] = '\0';
        (pCVar19->state).uploadbuffer[0x10] = '\0';
        (pCVar19->state).uploadbuffer[0x11] = '\0';
        (pCVar19->state).uploadbuffer[0x12] = '\0';
        (pCVar19->state).uploadbuffer[0x13] = '\0';
        (pCVar19->state).uploadbuffer[0x14] = '\0';
        (pCVar19->state).uploadbuffer[0x15] = '\0';
        (pCVar19->state).uploadbuffer[0x16] = '\0';
        (pCVar19->state).uploadbuffer[0x17] = '\0';
        (pCVar19->state).uploadbuffer[0x18] = '\0';
        (pCVar19->state).uploadbuffer[0x19] = '\0';
        (pCVar19->state).uploadbuffer[0x1a] = '\0';
        (pCVar19->state).uploadbuffer[0x1b] = '\0';
        (pCVar19->state).uploadbuffer[0x1c] = '\0';
        (pCVar19->state).uploadbuffer[0x1d] = '\0';
        (pCVar19->state).uploadbuffer[0x1e] = '\0';
        (pCVar19->state).uploadbuffer[0x1f] = '\0';
        *(ushort *)((pCVar19->state).uploadbuffer + 2) =
             (sVar18 + 0x40U) * 0x100 | (ushort)(sVar18 + 0x40U) >> 8;
        (pCVar19->state).uploadbuffer[4] = -1;
        (pCVar19->state).uploadbuffer[5] = 'S';
        (pCVar19->state).uploadbuffer[6] = 'M';
        (pCVar19->state).uploadbuffer[7] = 'B';
        (pCVar19->state).uploadbuffer[8] = '/';
        (pCVar19->state).uploadbuffer[0xd] = '\x18';
        (pCVar19->state).uploadbuffer[0xe] = 'A';
        (pCVar19->state).uploadbuffer[0xf] = '\0';
        *(unsigned_short *)((pCVar19->state).uploadbuffer + 0x20) = (conn->proto).smbc.uid;
        *(undefined2 *)((pCVar19->state).uploadbuffer + 0x1c) = *(undefined2 *)((long)pvVar7 + 0x18)
        ;
        _Var13 = getpid();
        *(short *)((pCVar19->state).uploadbuffer + 0x10) = (short)((uint)_Var13 >> 0x10);
        *(short *)((pCVar19->state).uploadbuffer + 0x1e) = (short)_Var13;
        CVar11 = smb_send(conn,0x44,upload_size);
        uVar12 = 4;
        goto LAB_005750a1;
      }
      cVar6 = *(curl_off_t *)((long)local_470 + 0x5c);
      (pCVar19->req).size = cVar6;
      Curl_pgrsSetDownloadSize(pCVar19,cVar6);
LAB_00575103:
      (conn->proto).ftpc.pp.response.tv_usec = 0;
      cVar6 = (conn->data->req).offset;
      uStack_452 = 0;
      acStack_451[0] = '\0';
      acStack_451[1] = 0;
      uStack_44b = 0;
      local_462 = 0;
      uStack_461 = 0;
      acStack_457[2] = 0;
      uStack_454 = 0;
      local_464 = 0xc;
      uStack_463 = 0xff;
      uVar3 = *(undefined2 *)((long)(conn->data->req).protop + 0x1a);
      uStack_45f = (undefined1)uVar3;
      uStack_45e = (undefined1)((ushort)uVar3 >> 8);
      uStack_45d = (undefined1)cVar6;
      uStack_45c = (undefined1)((ulong)cVar6 >> 8);
      uStack_45b._0_1_ = (undefined1)((ulong)cVar6 >> 0x10);
      uStack_45b._1_1_ = (undefined1)((ulong)cVar6 >> 0x18);
      uStack_44f = (undefined4)((ulong)cVar6 >> 0x20);
      uStack_459 = 0x8000;
      acStack_457[0] = '\0';
      acStack_457[1] = 0x80;
      CVar11 = smb_send_message(conn,'.',&local_464,0x1b);
      uVar12 = 3;
      goto LAB_005750a1;
    }
    piVar4[7] = 0x4e;
  case 5:
    (conn->proto).ftpc.pp.response.tv_usec = 0;
    local_462 = 0;
    local_464 = 0;
    uStack_463 = 0;
    CVar11 = smb_send_message(conn,'q',&local_464,3);
    uVar12 = 6;
    goto LAB_005750a1;
  case 3:
    CVar11 = CURLE_RECV_ERROR;
    if ((*(int *)((long)local_470 + 9) == 0) &&
       (0x31 < (ulong)(conn->proto).ftpc.pp.response.tv_usec)) {
      uVar8 = Curl_read16_le((uchar *)((long)local_470 + 0x2f));
      uVar9 = Curl_read16_le((uchar *)((long)pvVar7 + 0x31));
      if (uVar8 == 0) {
        len = 0;
LAB_005750d8:
        pCVar19 = conn->data;
        lVar17 = (pCVar19->req).bytecount + len;
        (pCVar19->req).bytecount = lVar17;
        pcVar1 = &(pCVar19->req).offset;
        *pcVar1 = *pcVar1 + len;
        Curl_pgrsSetDownloadCounter(pCVar19,lVar17);
        if (-1 < (short)uVar8) goto LAB_00575055;
        goto LAB_00575103;
      }
      len = (ulong)uVar8;
      if ((ulong)(conn->proto).ftpc.pp.response.tv_usec < uVar9 + len + 4) {
        Curl_failf(conn->data,"Invalid input packet");
      }
      else {
        CVar11 = Curl_client_write(conn,1,(char *)((long)pvVar7 + (ulong)uVar9 + 4),len);
        if (CVar11 == CURLE_OK) goto LAB_005750d8;
      }
    }
LAB_00575051:
    piVar4[7] = CVar11;
    goto LAB_00575055;
  case 4:
    CVar11 = CURLE_UPLOAD_FAILED;
    if ((*(int *)((long)local_470 + 9) != 0) ||
       ((ulong)(conn->proto).ftpc.pp.response.tv_usec < 0x2a)) goto LAB_00575051;
    uVar8 = Curl_read16_le((uchar *)((long)local_470 + 0x29));
    pCVar19 = conn->data;
    lVar17 = (pCVar19->req).bytecount + (ulong)uVar8;
    (pCVar19->req).bytecount = lVar17;
    pcVar1 = &(pCVar19->req).offset;
    *pcVar1 = *pcVar1 + (ulong)uVar8;
    Curl_pgrsSetUploadCounter(pCVar19,lVar17);
    pCVar19 = conn->data;
    lVar17 = (pCVar19->req).size;
    lVar16 = (pCVar19->req).bytecount;
    if (lVar16 < lVar17) goto LAB_00574ecf;
LAB_00575055:
    (conn->proto).ftpc.pp.response.tv_usec = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    local_464 = 3;
    uVar3 = *(undefined2 *)((long)(conn->data->req).protop + 0x1a);
    uStack_463 = (undefined1)uVar3;
    local_462 = (undefined1)((ushort)uVar3 >> 8);
    CVar11 = smb_send_message(conn,'\x04',&local_464,9);
    uVar12 = 5;
    goto LAB_005750a1;
  case 6:
    CVar11 = piVar4[7];
    break;
  default:
    (conn->proto).ftpc.pp.response.tv_usec = 0;
    return CURLE_OK;
  }
  (conn->proto).ftpc.pp.response.tv_usec = 0;
  *done = true;
  uVar12 = 7;
LAB_005750a1:
  if (CVar11 == CURLE_OK) {
    *(undefined4 *)(conn->data->req).protop = uVar12;
  }
  else {
    Curl_conncontrol(conn,1);
    CVar10 = CVar11;
  }
  return CVar10;
}

Assistant:

static CURLcode smb_request_state(struct connectdata *conn, bool *done)
{
  struct smb_request *req = conn->data->req.protop;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(conn);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(conn, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(conn, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    req->fid = smb_swap16(((struct smb_nt_create_response *)msg)->fid);
    conn->data->req.offset = 0;
    if(conn->data->set.upload) {
      conn->data->req.size = conn->data->state.infilesize;
      Curl_pgrsSetUploadSize(conn->data, conn->data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      conn->data->req.size =
        smb_swap64(((struct smb_nt_create_response *)msg)->end_of_file);
      Curl_pgrsSetDownloadSize(conn->data, conn->data->req.size);
      next_state = SMB_DOWNLOAD;
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(conn->data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(conn, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetDownloadCounter(conn->data, conn->data->req.bytecount);
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetUploadCounter(conn->data, conn->data->req.bytecount);
    if(conn->data->req.bytecount >= conn->data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(conn);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(conn);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(conn);
    break;

  case SMB_CLOSE:
    result = smb_send_close(conn);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(conn);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(conn, next_state);

  return CURLE_OK;
}